

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O0

bool __thiscall
toml::basic_value<toml::type_config>::is_array_of_tables(basic_value<toml::type_config> *this)

{
  bool bVar1;
  basic_value<toml::type_config> *in_RDI;
  basic_value<toml::type_config> *e;
  const_iterator __end0;
  const_iterator __begin0;
  array_type *__range2;
  array_type *a;
  nothrow_t *in_stack_ffffffffffffffb8;
  vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
  *in_stack_ffffffffffffffd0;
  __normal_iterator<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
  local_28;
  array_type *local_20;
  array_type *local_18;
  bool local_1;
  
  bVar1 = is_array((basic_value<toml::type_config> *)0x6893e8);
  if (bVar1) {
    local_18 = as_array(in_RDI,in_stack_ffffffffffffffb8);
    bVar1 = std::
            vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
            ::empty(in_stack_ffffffffffffffd0);
    if (bVar1) {
      local_1 = false;
    }
    else {
      local_20 = local_18;
      local_28._M_current =
           (basic_value<toml::type_config> *)
           std::
           vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
           ::begin((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                    *)in_stack_ffffffffffffffb8);
      std::
      vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
      ::end((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
             *)in_stack_ffffffffffffffb8);
      while (bVar1 = __gnu_cxx::
                     operator==<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                               ((__normal_iterator<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                                 *)in_RDI,
                                (__normal_iterator<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                                 *)in_stack_ffffffffffffffb8), ((bVar1 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
        ::operator*(&local_28);
        bVar1 = is_table((basic_value<toml::type_config> *)0x68947b);
        if (!bVar1) {
          return false;
        }
        __gnu_cxx::
        __normal_iterator<const_toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
        ::operator++(&local_28);
      }
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool is_array_of_tables() const noexcept
    {
        if( ! this->is_array()) {return false;}
        const auto& a = this->as_array(std::nothrow); // already checked.

        // when you define [[array.of.tables]], at least one empty table will be
        // assigned. In case of array of inline tables, `array_of_tables = []`,
        // there is no reason to consider this as an array of *tables*.
        // So empty array is not an array-of-tables.
        if(a.empty()) {return false;}

        // since toml v1.0.0 allows array of heterogeneous types, we need to
        // check all the elements. if any of the elements is not a table, it
        // is a heterogeneous array and cannot be expressed by `[[aot]]` form.
        for(const auto& e : a)
        {
            if( ! e.is_table()) {return false;}
        }
        return true;
    }